

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.hpp
# Opt level: O0

bool __thiscall
Diligent::GLContextState::BoundImageInfo::operator!=(BoundImageInfo *this,BoundImageInfo *rhs)

{
  bool local_19;
  BoundImageInfo *rhs_local;
  BoundImageInfo *this_local;
  
  local_19 = true;
  if ((((this->InterfaceID == rhs->InterfaceID) &&
       (local_19 = true, this->GLHandle == rhs->GLHandle)) &&
      (local_19 = true, this->MipLevel == rhs->MipLevel)) &&
     (((local_19 = true, this->IsLayered == rhs->IsLayered &&
       (local_19 = true, this->Layer == rhs->Layer)) &&
      (local_19 = true, this->Access == rhs->Access)))) {
    local_19 = this->Format != rhs->Format;
  }
  return local_19;
}

Assistant:

constexpr bool operator!=(const BoundImageInfo& rhs) const
        {
            // clang-format off
            return InterfaceID != rhs.InterfaceID ||
                   GLHandle    != rhs.GLHandle    ||
                   MipLevel    != rhs.MipLevel    ||
                   IsLayered   != rhs.IsLayered   ||
                   Layer       != rhs.Layer       ||
                   Access      != rhs.Access      ||
                   Format      != rhs.Format;
            // clang-format on
        }